

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui-ws.cpp
# Opt level: O2

void __thiscall ImGuiWS::Impl::Events::push(Events *this,Event *event)

{
  std::mutex::lock(&this->mutex);
  std::deque<ImGuiWS::Event,_std::allocator<ImGuiWS::Event>_>::emplace_back<ImGuiWS::Event>
            (&this->data,event);
  std::condition_variable::notify_one();
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex);
  return;
}

Assistant:

void push(Event && event) {
            std::lock_guard<std::mutex> lock(mutex);
            data.push_back(std::move(event));
            cv.notify_one();
        }